

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derDecDeep(octet *der,size_t count,size_t deep)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  size_t len;
  u32 tag;
  size_t local_30;
  uint local_24;
  
  if (0x20 < deep) {
    return 0xffffffffffffffff;
  }
  sVar2 = derTLDec(&local_24,&local_30,der,count);
  if ((sVar2 == 0xffffffffffffffff) || (sVar3 = local_30 + sVar2, uVar1 = local_24, count < sVar3))
  {
LAB_001110ff:
    sVar3 = 0xffffffffffffffff;
  }
  else {
    do {
      uVar4 = uVar1;
      uVar1 = uVar4 >> 8;
    } while (0xff < uVar4);
    if ((uVar4 & 0x20) == 0) {
      if ((int)local_24 < 6) {
        if (local_24 == 3) {
          sVar3 = derTBITDec((octet *)0x0,&local_30,der,count,3);
        }
        else if (local_24 == 5) {
          sVar3 = derDec4(der,count,5,(void *)0x0,0);
        }
      }
      else if (local_24 == 6) {
        sVar3 = derOIDDec((char *)0x0,&local_30,der,count);
      }
      else if (local_24 == 0x13) {
        sVar3 = derTPSTRDec((char *)0x0,&local_30,der,count,0x13);
      }
    }
    else {
      sVar3 = sVar2;
      for (; local_30 != 0; local_30 = local_30 - sVar2) {
        sVar2 = derDecDeep(der + sVar3,local_30,deep + 1);
        if (sVar2 == 0xffffffffffffffff) goto LAB_001110ff;
        sVar3 = sVar3 + sVar2;
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t derDecDeep(const octet der[], size_t count, size_t deep)
{
	u32 tag;
	size_t len;
	size_t c;
	// превышена глубина вложенности?
	if (deep > 32)
		return SIZE_MAX;
	// обработать TL
	c = derTLDec(&tag, &len, der, count);
	if (c == SIZE_MAX || c + len > count)
		return SIZE_MAX;
	// примитивный код?
	if (derTIsPrimitive(tag))
	{
		if (tag == 0x03)
			return derBITDec(0, &len, der, count);
		if (tag == 0x05)
			return derNULLDec(der, count);
		if (tag == 0x06)
			return derOIDDec(0, &len, der, count);
		if (tag == 0x13)
			return derPSTRDec(0, &len, der, count);
		return c + len;
	}
	// конструктивный код
	while (len)
	{
		size_t c1;
		c1 = derDecDeep(der + c, len, deep + 1);
		if (c1 == SIZE_MAX)
			return SIZE_MAX;
		c += c1, len -= c1;
	}
	return c;
}